

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfMan.c
# Opt level: O3

void Cnf_DataWriteIntoFile
               (Cnf_Dat_t *p,char *pFileName,int fReadable,Vec_Int_t *vForAlls,Vec_Int_t *vExists)

{
  uint uVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  FILE *__s;
  long lVar6;
  uint *puVar7;
  
  sVar5 = strlen(pFileName);
  if (((pFileName[sVar5 - 3] == '.') && (pFileName[sVar5 - 2] == 'g')) &&
     (pFileName[sVar5 - 1] == 'z')) {
    Cnf_DataWriteIntoFileGz(p,pFileName,fReadable,vForAlls,vExists);
    return;
  }
  __s = fopen(pFileName,"w");
  if (__s == (FILE *)0x0) {
    puts("Cnf_WriteIntoFile(): Output file cannot be opened.");
    return;
  }
  fwrite("c Result of efficient AIG-to-CNF conversion using package CNF\n",0x3e,1,__s);
  fprintf(__s,"p cnf %d %d\n",(ulong)(uint)p->nVars,(ulong)(uint)p->nClauses);
  if (vForAlls != (Vec_Int_t *)0x0) {
    fwrite("a ",2,1,__s);
    if (0 < vForAlls->nSize) {
      lVar6 = 0;
      do {
        fprintf(__s,"%d ",(ulong)(vForAlls->pArray[lVar6] + (uint)(fReadable == 0)));
        lVar6 = lVar6 + 1;
      } while (lVar6 < vForAlls->nSize);
    }
    fwrite("0\n",2,1,__s);
  }
  if (vExists != (Vec_Int_t *)0x0) {
    fwrite("e ",2,1,__s);
    if (0 < vExists->nSize) {
      lVar6 = 0;
      do {
        fprintf(__s,"%d ",(ulong)(vExists->pArray[lVar6] + (uint)(fReadable == 0)));
        lVar6 = lVar6 + 1;
      } while (lVar6 < vExists->nSize);
    }
    fwrite("0\n",2,1,__s);
  }
  if (0 < p->nClauses) {
    lVar6 = 0;
    do {
      puVar2 = (uint *)p->pClauses[lVar6 + 1];
      for (puVar7 = (uint *)p->pClauses[lVar6]; puVar7 < puVar2; puVar7 = puVar7 + 1) {
        uVar1 = *puVar7;
        uVar4 = (int)uVar1 >> 1;
        if (fReadable == 0) {
          uVar3 = ~uVar4;
          if ((uVar1 & 1) == 0) {
            uVar3 = uVar4 + 1;
          }
        }
        else {
          uVar3 = -uVar4;
          if ((uVar1 & 1) == 0) {
            uVar3 = uVar4;
          }
        }
        fprintf(__s,"%d ",(ulong)uVar3);
      }
      lVar6 = lVar6 + 1;
      fwrite("0\n",2,1,__s);
    } while (lVar6 < p->nClauses);
  }
  fputc(10,__s);
  fclose(__s);
  return;
}

Assistant:

void Cnf_DataWriteIntoFile( Cnf_Dat_t * p, char * pFileName, int fReadable, Vec_Int_t * vForAlls, Vec_Int_t * vExists )
{
    FILE * pFile;
    int * pLit, * pStop, i, VarId;
    if ( !strncmp(pFileName+strlen(pFileName)-3,".gz",3) ) 
    {
        Cnf_DataWriteIntoFileGz( p, pFileName, fReadable, vForAlls, vExists );
        return;
    }
    pFile = fopen( pFileName, "w" );
    if ( pFile == NULL )
    {
        printf( "Cnf_WriteIntoFile(): Output file cannot be opened.\n" );
        return;
    }
    fprintf( pFile, "c Result of efficient AIG-to-CNF conversion using package CNF\n" );
    fprintf( pFile, "p cnf %d %d\n", p->nVars, p->nClauses );
    if ( vForAlls )
    {
        fprintf( pFile, "a " );
        Vec_IntForEachEntry( vForAlls, VarId, i )
            fprintf( pFile, "%d ", fReadable? VarId : VarId+1 );
        fprintf( pFile, "0\n" );
    }
    if ( vExists )
    {
        fprintf( pFile, "e " );
        Vec_IntForEachEntry( vExists, VarId, i )
            fprintf( pFile, "%d ", fReadable? VarId : VarId+1 );
        fprintf( pFile, "0\n" );
    }
    for ( i = 0; i < p->nClauses; i++ )
    {
        for ( pLit = p->pClauses[i], pStop = p->pClauses[i+1]; pLit < pStop; pLit++ )
            fprintf( pFile, "%d ", fReadable? Cnf_Lit2Var2(*pLit) : Cnf_Lit2Var(*pLit) );
        fprintf( pFile, "0\n" );
    }
    fprintf( pFile, "\n" );
    fclose( pFile );
}